

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

bool __thiscall soul::Identifier::operator==(Identifier *this,string_view other)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  Identifier *this_local;
  string_view other_local;
  
  bVar1 = isValid(this);
  checkAssertion(bVar1,"isValid()","operator==",0x28);
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)this->name);
  bVar1 = std::operator==(__x,other);
  return bVar1;
}

Assistant:

bool operator== (std::string_view other) const                  { SOUL_ASSERT (isValid()); return *name == other; }